

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_symbol_codec.cpp
# Opt level: O2

void __thiscall lzham::symbol_codec::remove_bits(symbol_codec *this,uint num_bits)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  byte *pbVar4;
  
  if (num_bits != 0) {
    iVar2 = this->m_bit_count;
    while (iVar2 < (int)num_bits) {
      pbVar4 = this->m_pDecode_buf_next;
      if (pbVar4 == this->m_pDecode_buf_end) {
        if (this->m_decode_buf_eof == false) {
          (*this->m_pDecode_need_bytes_func)
                    ((long)pbVar4 - (long)this->m_pDecode_buf,this->m_pDecode_private_data,
                     &this->m_pDecode_buf,&this->m_decode_buf_size,&this->m_decode_buf_eof);
          pbVar4 = this->m_pDecode_buf;
          this->m_pDecode_buf_end = pbVar4 + this->m_decode_buf_size;
          this->m_pDecode_buf_next = pbVar4;
          if (0 < (long)this->m_decode_buf_size) goto LAB_00115c4a;
        }
        uVar3 = 0;
      }
      else {
LAB_00115c4a:
        this->m_pDecode_buf_next = pbVar4 + 1;
        uVar3 = (ulong)*pbVar4;
      }
      iVar1 = this->m_bit_count;
      iVar2 = iVar1 + 8;
      this->m_bit_count = iVar2;
      this->m_bit_buf = this->m_bit_buf | uVar3 << (0x38U - (char)iVar1 & 0x3f);
    }
    this->m_bit_buf = this->m_bit_buf << ((byte)num_bits & 0x3f);
    this->m_bit_count = iVar2 - num_bits;
  }
  return;
}

Assistant:

void symbol_codec::remove_bits(uint num_bits)
   {
      LZHAM_ASSERT(num_bits <= 25);

      if (!num_bits)
         return;

      while (m_bit_count < (int)num_bits)
      {
         uint c = 0;
         if (m_pDecode_buf_next == m_pDecode_buf_end)
         {
            if (!m_decode_buf_eof)
            {
               m_pDecode_need_bytes_func(m_pDecode_buf_next - m_pDecode_buf, m_pDecode_private_data, m_pDecode_buf, m_decode_buf_size, m_decode_buf_eof);
               m_pDecode_buf_end = m_pDecode_buf + m_decode_buf_size;
               m_pDecode_buf_next = m_pDecode_buf;
               if (m_pDecode_buf_next < m_pDecode_buf_end) c = *m_pDecode_buf_next++;
            }
         }
         else
            c = *m_pDecode_buf_next++;

         m_bit_count += 8;
         LZHAM_ASSERT(m_bit_count <= cBitBufSize);

         m_bit_buf |= (static_cast<bit_buf_t>(c) << (cBitBufSize - m_bit_count));
      }

      m_bit_buf <<= num_bits;
      m_bit_count -= num_bits;
   }